

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeMemZeroTerminateIfAble(Mem *pMem)

{
  sqlite3_uint64 sVar1;
  Mem *pMem_local;
  
  if ((((pMem->flags & 0x6202) == 2) && (pMem->enc == '\x01')) && (pMem->z != (char *)0x0)) {
    if ((pMem->flags & 0x1000) == 0) {
      if (pMem->n + 1 <= pMem->szMalloc) {
        pMem->z[pMem->n] = '\0';
        pMem->flags = pMem->flags | 0x200;
      }
    }
    else if ((pMem->xDel == sqlite3_free) &&
            (sVar1 = sqlite3_msize(pMem->z), (ulong)(long)(pMem->n + 1) <= sVar1)) {
      pMem->z[pMem->n] = '\0';
      pMem->flags = pMem->flags | 0x200;
    }
    else if (pMem->xDel == sqlite3RCStrUnref) {
      pMem->flags = pMem->flags | 0x200;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMemZeroTerminateIfAble(Mem *pMem){
  if( (pMem->flags & (MEM_Str|MEM_Term|MEM_Ephem|MEM_Static))!=MEM_Str ){
    /* pMem must be a string, and it cannot be an ephemeral or static string */
    return;
  }
  if( pMem->enc!=SQLITE_UTF8 ) return;
  if( NEVER(pMem->z==0) ) return;
  if( pMem->flags & MEM_Dyn ){
    if( pMem->xDel==sqlite3_free
     && sqlite3_msize(pMem->z) >= (u64)(pMem->n+1)
    ){
      pMem->z[pMem->n] = 0;
      pMem->flags |= MEM_Term;
      return;
    }
    if( pMem->xDel==sqlite3RCStrUnref ){
      /* Blindly assume that all RCStr objects are zero-terminated */
      pMem->flags |= MEM_Term;
      return;
    }
  }else if( pMem->szMalloc >= pMem->n+1 ){
    pMem->z[pMem->n] = 0;
    pMem->flags |= MEM_Term;
    return;
  }
}